

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1Test.cpp
# Opt level: O1

EStatusCode SaveCharstringCode(char **argv,string *inCharStringName,Type1Input *inType1Input)

{
  EStatusCode EVar1;
  long *plVar2;
  IByteWriter *inWriter;
  long *plVar3;
  size_type *psVar4;
  CharStringType1Tracer tracer;
  OutputFile glyphFile;
  allocator<char> local_129;
  string local_128;
  Type1Input *local_108;
  long *local_100;
  long local_f8;
  long local_f0;
  long lStack_e8;
  CharStringType1Tracer local_e0;
  long *local_c0 [2];
  long local_b0 [2];
  string local_a0;
  string local_80;
  OutputFile local_60;
  
  local_108 = inType1Input;
  OutputFile::OutputFile(&local_60);
  local_c0[0] = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"glyphType1_","");
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_c0,(ulong)(inCharStringName->_M_dataplus)._M_p);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_f0 = *plVar3;
    lStack_e8 = plVar2[3];
    local_100 = &local_f0;
  }
  else {
    local_f0 = *plVar3;
    local_100 = (long *)*plVar2;
  }
  local_f8 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_100);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_128.field_2._M_allocated_capacity = *psVar4;
    local_128.field_2._8_8_ = plVar2[3];
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  }
  else {
    local_128.field_2._M_allocated_capacity = *psVar4;
    local_128._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_128._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,argv[2],&local_129);
  LocalPathToFileURL((FileURL *)&local_e0,&local_80);
  RelativeURLToLocalPath(&local_a0,(FileURL *)&local_e0,&local_128);
  FileURL::~FileURL((FileURL *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  EVar1 = OutputFile::OpenFile(&local_60,&local_a0,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100,local_f0 + 1);
  }
  if (local_c0[0] != local_b0) {
    operator_delete(local_c0[0],local_b0[0] + 1);
  }
  if (EVar1 == eSuccess) {
    CharStringType1Tracer::CharStringType1Tracer(&local_e0);
    inWriter = &OutputFile::GetOutputStream(&local_60)->super_IByteWriter;
    EVar1 = CharStringType1Tracer::TraceGlyphProgram(&local_e0,inCharStringName,local_108,inWriter);
    CharStringType1Tracer::~CharStringType1Tracer(&local_e0);
  }
  OutputFile::CloseFile(&local_60);
  OutputFile::~OutputFile(&local_60);
  return EVar1;
}

Assistant:

static EStatusCode SaveCharstringCode(char* argv[],const string& inCharStringName,Type1Input* inType1Input)
{
	OutputFile glyphFile;

    
	EStatusCode status = glyphFile.OpenFile(
                                            BuildRelativeOutputPath(argv,string("glyphType1_") + inCharStringName + "_.txt"));

	do
	{
		if(status != PDFHummus::eSuccess)
			break;
		
		CharStringType1Tracer tracer;

		status = tracer.TraceGlyphProgram(inCharStringName,inType1Input,glyphFile.GetOutputStream());

	}while(false);

	glyphFile.CloseFile();

	return status;

}